

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ExprList *out_elem_expr)

{
  bool bVar1;
  bool bVar2;
  Enum EVar3;
  size_type sVar4;
  Result local_58;
  _Type local_54;
  Enum local_4c;
  undefined4 local_48;
  Result local_44;
  undefined1 local_40 [8];
  ExprList exprs;
  bool item;
  ExprList *out_elem_expr_local;
  WastParser *this_local;
  
  exprs.size_._7_1_ = MatchLpar(this,Item);
  intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_40);
  if ((exprs.size_._7_1_ & 1) == 0) {
    local_54 = (_Type)PeekPair(this);
    bVar2 = anon_unknown_1::IsExpr((TokenTypePair)local_54);
    bVar1 = true;
    if (bVar2) {
      local_58 = ParseExpr(this,(ExprList *)local_40);
      EVar3 = Result::operator_cast_to_Enum(&local_58);
      bVar1 = EVar3 != Ok;
    }
    if (bVar1) {
      this_local._7_1_ = false;
      goto LAB_00217a5d;
    }
  }
  else {
    local_44 = ParseTerminatingInstrList(this,(ExprList *)local_40);
    EVar3 = Result::operator_cast_to_Enum(&local_44);
    if (EVar3 != Ok) {
      this_local._7_1_ = false;
      goto LAB_00217a5d;
    }
    local_4c = (Enum)Expect(this,Rpar);
    bVar1 = Failed((Result)local_4c);
    if (bVar1) {
      this_local._7_1_ = true;
      goto LAB_00217a5d;
    }
  }
  sVar4 = intrusive_list<wabt::Expr>::size((intrusive_list<wabt::Expr> *)local_40);
  if (sVar4 == 0) {
    this_local._7_1_ = false;
  }
  else {
    intrusive_list<wabt::Expr>::operator=(out_elem_expr,(intrusive_list<wabt::Expr> *)local_40);
    this_local._7_1_ = true;
  }
LAB_00217a5d:
  local_48 = 1;
  intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseElemExprOpt(ExprList* out_elem_expr) {
  WABT_TRACE(ParseElemExprOpt);
  bool item = MatchLpar(TokenType::Item);
  ExprList exprs;
  if (item) {
    if (ParseTerminatingInstrList(&exprs) != Result::Ok) {
      return false;
    }
    EXPECT(Rpar);
  } else {
    if (!IsExpr(PeekPair()) || ParseExpr(&exprs) != Result::Ok) {
      return false;
    }
  }
  if (!exprs.size()) {
    return false;
  }
  *out_elem_expr = std::move(exprs);
  return true;
}